

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

Hashtable * __thiscall icu_63::NFFactory::getSupportedIDs(NFFactory *this,UErrorCode *status)

{
  uint in_EAX;
  int iVar1;
  undefined4 extraout_var;
  Hashtable *this_00;
  int32_t *size;
  int i;
  long lVar2;
  ulong uStack_28;
  int32_t count;
  UnicodeString *key;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->_ids != (Hashtable *)0x0) {
      return this->_ids;
    }
    size = &count;
    uStack_28 = (ulong)in_EAX;
    iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[4])(this->_delegate,size,status);
    key = (UnicodeString *)CONCAT44(extraout_var,iVar1);
    this_00 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
    if (this_00 != (Hashtable *)0x0) {
      Hashtable::Hashtable(this_00,status);
      this->_ids = this_00;
      lVar2 = 0;
      while( true ) {
        if (count <= lVar2) break;
        Hashtable::put(this->_ids,key,this,status);
        lVar2 = lVar2 + 1;
        key = key + 1;
      }
      return this->_ids;
    }
    this->_ids = (Hashtable *)0x0;
  }
  return (Hashtable *)0x0;
}

Assistant:

UnicodeString&
NumberFormat::format(double number, UnicodeString& appendTo) const
{
    FieldPosition pos(FieldPosition::DONT_CARE);
    return format(number, appendTo, pos);
}